

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelbin.cpp
# Opt level: O0

Mat * __thiscall ncnn::ModelBin::load(ModelBin *this,int w,int h,int d,int c,int type)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  Mat *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined4 in_stack_00000008;
  Mat m;
  Allocator *in_stack_00000130;
  void *local_d8;
  int *local_d0;
  size_t local_c8;
  int local_c0;
  Allocator *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  size_t local_98;
  void **local_70;
  void **local_68;
  void **local_58;
  void **local_48;
  int local_40;
  undefined4 local_3c;
  int local_20;
  undefined4 local_1c;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  Mat *in_stack_fffffffffffffff8;
  
  (**(code **)(*in_RSI + 0x10))
            (&local_d8,in_RSI,in_EDX * in_ECX * in_R8D * in_R9D,in_stack_00000008);
  local_70 = &local_d8;
  if (local_d8 != (void *)0x0) {
    local_48 = local_70;
  }
  if (local_d8 != (void *)0x0 && local_98 * (long)local_a0 != 0) {
    Mat::reshape(in_stack_fffffffffffffff8,(int)((ulong)in_stack_fffffffffffffff0 >> 0x20),
                 (int)in_stack_fffffffffffffff0,(int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                 (int)in_stack_ffffffffffffffe8,in_stack_00000130);
  }
  else {
    local_68 = &local_d8;
    in_RDI->data = local_d8;
    in_RDI->refcount = local_d0;
    in_RDI->elemsize = local_c8;
    in_RDI->elempack = local_c0;
    in_RDI->allocator = local_b8;
    in_RDI->dims = local_b0;
    in_RDI->w = local_ac;
    in_RDI->h = local_a8;
    in_RDI->d = local_a4;
    in_RDI->c = local_a0;
    in_RDI->cstep = local_98;
    if (in_RDI->refcount != (int *)0x0) {
      piVar1 = in_RDI->refcount;
      local_3c = 1;
      LOCK();
      local_40 = *piVar1;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
  }
  local_58 = &local_d8;
  if (local_d0 != (int *)0x0) {
    local_1c = 0xffffffff;
    LOCK();
    local_20 = *local_d0;
    *local_d0 = *local_d0 + -1;
    UNLOCK();
    if (local_20 == 1) {
      if (local_b8 == (Allocator *)0x0) {
        if (local_d8 != (void *)0x0) {
          free(local_d8);
        }
      }
      else {
        (*local_b8->_vptr_Allocator[3])(local_b8,local_d8);
      }
    }
  }
  return in_RDI;
}

Assistant:

Mat ModelBin::load(int w, int h, int d, int c, int type) const
{
    Mat m = load(w * h * d * c, type);
    if (m.empty())
        return m;

    return m.reshape(w, h, d, c);
}